

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

void parseExternalPalSpec(char *arg)

{
  anon_class_16_2_4417ab41_for__M_pred __pred;
  iterator pvVar1;
  iterator __last;
  tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
  *ptVar2;
  ulong *puVar3;
  __tuple_element_t<2UL,_tuple<const_char_*,_void_(*)(basic_filebuf<char>_&),__Ios_Openmode>_>
  *p_Var4;
  long lVar5;
  __tuple_element_t<1UL,_tuple<const_char_*,_void_(*)(basic_filebuf<char>_&),__Ios_Openmode>_>
  *pp_Var6;
  basic_filebuf<char,_std::char_traits<char>_> local_138 [8];
  filebuf file;
  long local_48;
  long local_40;
  char **local_38;
  char **local_30;
  tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
  *local_28;
  tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
  *iter;
  char *path;
  char *ptr;
  char *arg_local;
  
  ptr = arg;
  path = strchr(arg,0x3a);
  if (path == (char *)0x0) {
    error("External palette spec must have format `fmt:path` (missing colon)");
  }
  else {
    iter = (tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
            *)(path + 1);
    pvVar1 = std::
             array<std::tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>,_6UL>
             ::begin(&parseExternalPalSpec::parsers);
    __last = std::
             array<std::tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>,_6UL>
             ::end(&parseExternalPalSpec::parsers);
    local_38 = &ptr;
    local_30 = &path;
    __pred.ptr = local_30;
    __pred.arg = local_38;
    ptVar2 = std::
             find_if<std::tuple<char_const*,void(*)(std::filebuf&),std::_Ios_Openmode>*,parseExternalPalSpec(char_const*)::__0>
                       (pvVar1,__last,__pred);
    local_28 = ptVar2;
    pvVar1 = std::
             array<std::tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>,_6UL>
             ::end(&parseExternalPalSpec::parsers);
    if (ptVar2 == pvVar1) {
      local_40 = (long)path - (long)ptr;
      local_48 = 0x7fffffff;
      puVar3 = (ulong *)std::min<long>(&local_40,&local_48);
      error("Unknown external palette format \"%.*s\"",*puVar3 & 0xffffffff,ptr);
    }
    else {
      std::filebuf::filebuf(local_138);
      ptVar2 = iter;
      p_Var4 = std::get<2ul,char_const*,void(*)(std::filebuf&),std::_Ios_Openmode>(local_28);
      std::operator|(_S_in,*p_Var4);
      lVar5 = std::filebuf::open((char *)local_138,(_Ios_Openmode)ptVar2);
      if (lVar5 == 0) {
        error("Failed to open palette file \"%s\"",iter);
      }
      else {
        pp_Var6 = std::get<1ul,char_const*,void(*)(std::filebuf&),std::_Ios_Openmode>(local_28);
        (**pp_Var6)(local_138);
      }
      std::filebuf::~filebuf(local_138);
    }
  }
  return;
}

Assistant:

void parseExternalPalSpec(char const *arg) {
	// `fmt:path`, parse the file according to the given format

	// Split both parts, error out if malformed
	char const *ptr = strchr(arg, ':');
	if (ptr == nullptr) {
		error("External palette spec must have format `fmt:path` (missing colon)");
		return;
	}
	char const *path = ptr + 1;

	static std::array parsers{
	    std::tuple{"PSP", &parsePSPFile, std::ios::in    },
	    std::tuple{"GPL", &parseGPLFile, std::ios::in    },
	    std::tuple{"HEX", &parseHEXFile, std::ios::in    },
	    std::tuple{"ACT", &parseACTFile, std::ios::binary},
	    std::tuple{"ACO", &parseACOFile, std::ios::binary},
	    std::tuple{"GBC", &parseGBCFile, std::ios::binary},
	};

	auto iter = std::find_if(parsers.begin(), parsers.end(),
	                         [&arg, &ptr](decltype(parsers)::value_type const &parser) {
		                         return strncasecmp(arg, std::get<0>(parser), ptr - arg) == 0;
	                         });
	if (iter == parsers.end()) {
		error("Unknown external palette format \"%.*s\"",
		      static_cast<int>(std::min(ptr - arg, static_cast<decltype(ptr - arg)>(INT_MAX))),
		      arg);
		return;
	}

	std::filebuf file;
	// Some parsers read the file in text mode, others in binary mode
	if (!file.open(path, std::ios::in | std::get<2>(*iter))) {
		error("Failed to open palette file \"%s\"", path);
		return;
	}

	std::get<1> (*iter)(file);
}